

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuItem> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  undefined1 *local_40;
  QVariantMap local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuItem>::clear(list);
  while( true ) {
    cVar1 = QDBusArgument::atEnd();
    if (cVar1 != '\0') break;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    operator>>(arg,(QDBusMenuItem *)&local_40);
    QList<QDBusMenuItem>::emplaceBack<QDBusMenuItem_const&>(list,(QDBusMenuItem *)&local_40);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_38.d);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}